

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int itype;
  ggml_context *ctx;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  uint uVar6;
  allocator<char> local_6d;
  float local_6c;
  string fname_out;
  string fname_inp;
  
  ggml_time_init();
  if (argc == 4) {
    ctx = ggml_init((ggml_init_params)ZEXT816(0));
    ggml_free(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fname_inp,argv[1],(allocator<char> *)&fname_out);
    std::__cxx11::string::string<std::allocator<char>>((string *)&fname_out,argv[2],&local_6d);
    itype = atoi(argv[3]);
    iVar2 = ggml_time_us();
    iVar3 = ggml_time_us();
    bVar1 = llama_model_quantize(&fname_inp,&fname_out,itype);
    if (!bVar1) {
      fprintf(_stderr,"%s: failed to quantize model from \'%s\'\n","main",fname_inp._M_dataplus._M_p
             );
    }
    else {
      iVar4 = ggml_time_us();
      iVar5 = ggml_time_us();
      local_6c = (float)(iVar4 - iVar3);
      putchar(10);
      printf("%s: quantize time = %8.2f ms\n",(double)(local_6c / 1000.0),"main");
      printf("%s:    total time = %8.2f ms\n",(double)((float)(iVar5 - iVar2) / 1000.0),"main");
    }
    uVar6 = (uint)!bVar1;
    std::__cxx11::string::~string((string *)&fname_out);
    std::__cxx11::string::~string((string *)&fname_inp);
  }
  else {
    fprintf(_stderr,"usage: %s model-f32.bin model-quant.bin type\n",*argv);
    fwrite("  type = 2 - q4_0\n",0x12,1,_stderr);
    fwrite("  type = 3 - q4_1\n",0x12,1,_stderr);
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    if (argc != 4) {
        fprintf(stderr, "usage: %s model-f32.bin model-quant.bin type\n", argv[0]);
        fprintf(stderr, "  type = 2 - q4_0\n");
        fprintf(stderr, "  type = 3 - q4_1\n");
        return 1;
    }

    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    const std::string fname_inp = argv[1];
    const std::string fname_out = argv[2];

    const int itype = atoi(argv[3]);

    const int64_t t_main_start_us = ggml_time_us();

    int64_t t_quantize_us = 0;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!llama_model_quantize(fname_inp, fname_out, itype)) {
            fprintf(stderr, "%s: failed to quantize model from '%s'\n", __func__, fname_inp.c_str());
            return 1;
        }

        t_quantize_us = ggml_time_us() - t_start_us;
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n");
        printf("%s: quantize time = %8.2f ms\n", __func__, t_quantize_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    return 0;
}